

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode addReference(UA_Server *server,UA_Session *session,UA_AddReferencesItem *item)

{
  undefined8 local_120;
  UA_DeleteReferencesItem deleteItem;
  UA_AddReferencesItem secondItem;
  UA_StatusCode retval;
  UA_AddReferencesItem *item_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if ((item->targetServerUri).length == 0) {
    server_local._4_4_ =
         UA_Server_editNode(server,session,&item->sourceNodeId,addOneWayReference,item);
    if (server_local._4_4_ == 0) {
      UA_AddReferencesItem_init((UA_AddReferencesItem *)&deleteItem.deleteBidirectional);
      deleteItem._104_8_ = *(undefined8 *)&(item->targetNodeId).nodeId;
      server_local._4_4_ =
           UA_Server_editNode(server,session,(UA_NodeId *)&deleteItem.deleteBidirectional,
                              addOneWayReference,&deleteItem.deleteBidirectional);
      if (server_local._4_4_ != 0) {
        local_120._0_2_ = (item->sourceNodeId).namespaceIndex;
        local_120._2_2_ = *(undefined2 *)&(item->sourceNodeId).field_0x2;
        local_120._4_4_ = (item->sourceNodeId).identifierType;
        deleteItem.sourceNodeId._0_8_ = (item->sourceNodeId).identifier.string.length;
        deleteItem.sourceNodeId.identifier.string.length =
             (size_t)(item->sourceNodeId).identifier.string.data;
        deleteItem.sourceNodeId.identifier.string.data =
             (UA_Byte *)*(undefined8 *)&item->referenceTypeId;
        deleteItem.referenceTypeId._0_8_ = (item->referenceTypeId).identifier.string.length;
        deleteItem.referenceTypeId.identifier.string.length =
             (size_t)(item->referenceTypeId).identifier.string.data;
        deleteItem.referenceTypeId.identifier.guid.data4[0] = item->isForward & 1;
        memcpy(&deleteItem.isForward,&item->targetNodeId,0x30);
        deleteItem.targetNodeId.serverIndex._0_1_ = 0;
        UA_Server_editNode(server,session,&item->sourceNodeId,deleteOneWayReference,&local_120);
      }
    }
  }
  else {
    server_local._4_4_ = 0x80400000;
  }
  return server_local._4_4_;
}

Assistant:

static UA_StatusCode
addReference(UA_Server *server, UA_Session *session,
             const UA_AddReferencesItem *item) {
    /* Currently no expandednodeids are allowed */
    if(item->targetServerUri.length > 0)
        return UA_STATUSCODE_BADNOTIMPLEMENTED;

    /* Add the first direction */
#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    UA_StatusCode retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                              (UA_EditNodeCallback)addOneWayReference,
                                              item);
#else
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_Boolean handledExternally = UA_FALSE;
    for(size_t j = 0; j <server->externalNamespacesSize; ++j) {
        if(item->sourceNodeId.namespaceIndex != server->externalNamespaces[j].index) {
            continue;
        } else {
            UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
            retval = (UA_StatusCode)ens->addOneWayReference(ens->ensHandle, item);
            handledExternally = UA_TRUE;
            break;
        }
    }
    if(!handledExternally)
        retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                    (UA_EditNodeCallback)addOneWayReference, item);
#endif

    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Add the second direction */
    UA_AddReferencesItem secondItem;
    UA_AddReferencesItem_init(&secondItem);
    secondItem.sourceNodeId = item->targetNodeId.nodeId;
    secondItem.referenceTypeId = item->referenceTypeId;
    secondItem.isForward = !item->isForward;
    secondItem.targetNodeId.nodeId = item->sourceNodeId;
    /* keep default secondItem.targetNodeClass = UA_NODECLASS_UNSPECIFIED */
#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    retval = UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                                (UA_EditNodeCallback)addOneWayReference, &secondItem);
#else
    handledExternally = UA_FALSE;
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        if(secondItem.sourceNodeId.namespaceIndex != server->externalNamespaces[j].index) {
            continue;
        } else {
            UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
            retval = (UA_StatusCode)ens->addOneWayReference(ens->ensHandle, &secondItem);
            handledExternally = UA_TRUE;
            break;
        }
    }
    if(!handledExternally)
        retval = UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                                    (UA_EditNodeCallback)addOneWayReference, &secondItem);
#endif

    /* remove reference if the second direction failed */
    if(retval != UA_STATUSCODE_GOOD) {
        UA_DeleteReferencesItem deleteItem;
        deleteItem.sourceNodeId = item->sourceNodeId;
        deleteItem.referenceTypeId = item->referenceTypeId;
        deleteItem.isForward = item->isForward;
        deleteItem.targetNodeId = item->targetNodeId;
        deleteItem.deleteBidirectional = false;
        /* ignore returned status code */
        UA_Server_editNode(server, session, &item->sourceNodeId,
                           (UA_EditNodeCallback)deleteOneWayReference, &deleteItem);
    }
    return retval;
}